

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O0

void __thiscall
Buffer_change_event_add_printf_Test::TestBody(Buffer_change_event_add_printf_Test *this)

{
  initializer_list<bfy_changed_cb_info> __l;
  bool bVar1;
  size_t sVar2;
  const_pointer pvVar3;
  char *pcVar4;
  AssertHelper local_1b0;
  Message local_1a8;
  allocator<bfy_changed_cb_info> local_199;
  bfy_changed_cb_info local_198;
  iterator local_178;
  size_type local_170;
  vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> local_168;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_1;
  Message local_138;
  int local_130 [2];
  undefined1 local_128 [8];
  AssertionResult gtest_ar;
  bfy_changed_cb_info expected;
  size_type size;
  string_view str;
  undefined1 local_d0 [8];
  BufferWithReadonlyStrings local;
  Buffer_change_event_add_printf_Test *this_local;
  
  local.changes.super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)local_d0);
  size = 0x1a;
  str._M_len = (size_t)anon_var_dwarf_11aa1;
  sVar2 = bfy_buffer_get_content_len((bfy_buffer *)local_d0);
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::start_listening_to_changes
            ((BufferWithReadonlyStrings *)local_d0);
  local_130[1] = 0;
  pvVar3 = std::data<std::basic_string_view<char,std::char_traits<char>>>
                     ((basic_string_view<char,_std::char_traits<char>_> *)&size);
  local_130[0] = bfy_buffer_add_printf((bfy_buffer *)local_d0,"%s",pvVar3);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_128,"0","bfy_buffer_add_printf(&local.buf, \"%s\", std::data(str))",
             local_130 + 1,local_130);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x5ad,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  local_198.n_deleted = 0;
  local_198.n_added = 0x1a;
  local_178 = &local_198;
  local_170 = 1;
  local_198.orig_size = sVar2;
  std::allocator<bfy_changed_cb_info>::allocator(&local_199);
  __l._M_len = local_170;
  __l._M_array = local_178;
  std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>::vector
            (&local_168,__l,&local_199);
  testing::internal::EqHelper::
  Compare<std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>,_std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>,_nullptr>
            ((EqHelper *)local_150,"changes_t{expected}","local.changes",&local_168,
             (vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> *)
             ((long)&local.allstrs.field_2 + 8));
  std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>::~vector(&local_168);
  std::allocator<bfy_changed_cb_info>::~allocator(&local_199);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x5ae,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::~BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)local_d0);
  return;
}

Assistant:

TEST(Buffer, change_event_add_printf) {
    BufferWithReadonlyStrings local;
    auto constexpr str = std::string_view { "Lorem ipsum dolor sit amet" };
    auto constexpr size  = std::size(str);
    auto const expected = bfy_changed_cb_info {
        .orig_size = bfy_buffer_get_content_len(&local.buf),
        .n_added = size,
        .n_deleted = 0
    };

    local.start_listening_to_changes();
    EXPECT_EQ(0, bfy_buffer_add_printf(&local.buf, "%s", std::data(str)));
    EXPECT_EQ(changes_t{expected}, local.changes);
}